

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

void free_dungeon(void)

{
  branch *pbVar1;
  s_level *psVar2;
  s_level *__ptr;
  branch *__ptr_00;
  
  __ptr_00 = branches;
  if (branches != (branch *)0x0) {
    do {
      pbVar1 = __ptr_00->next;
      free(__ptr_00);
      __ptr_00 = pbVar1;
    } while (pbVar1 != (branch *)0x0);
  }
  branches = (branch *)0x0;
  __ptr = sp_levchn;
  while (__ptr != (s_level *)0x0) {
    psVar2 = __ptr->next;
    free(__ptr);
    __ptr = psVar2;
  }
  sp_levchn = (s_level *)0x0;
  return;
}

Assistant:

void free_dungeon(void)
{
    branch *curr, *next;
    
    for (curr = branches; curr; curr = next) {
	next = curr->next;
	free(curr);
    }
    branches = NULL;
    
    freelevchn();
}